

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bamtools_filter.cpp
# Opt level: O2

void __thiscall BamTools::FilterTool::~FilterTool(FilterTool *this)

{
  FilterSettings *this_00;
  FilterToolPrivate *this_01;
  
  (this->super_AbstractTool)._vptr_AbstractTool = (_func_int **)&PTR__FilterTool_001f1ef0;
  this_00 = this->m_settings;
  if (this_00 != (FilterSettings *)0x0) {
    FilterSettings::~FilterSettings(this_00);
  }
  operator_delete(this_00);
  this->m_settings = (FilterSettings *)0x0;
  this_01 = this->m_impl;
  if (this_01 != (FilterToolPrivate *)0x0) {
    FilterToolPrivate::~FilterToolPrivate(this_01);
  }
  operator_delete(this_01);
  this->m_impl = (FilterToolPrivate *)0x0;
  return;
}

Assistant:

FilterTool::~FilterTool()
{

    delete m_settings;
    m_settings = 0;

    delete m_impl;
    m_impl = 0;
}